

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

int4 __thiscall ActionReturnRecovery::apply(ActionReturnRecovery *this,Funcdata *data)

{
  PcodeOp *pPVar1;
  bool bVar2;
  int4 iVar3;
  int4 iVar4;
  uint4 uVar5;
  ParamActive *this_00;
  Architecture *pAVar6;
  ParamTrial *this_01;
  Varnode *invn;
  FuncProto *this_02;
  reference ppPVar7;
  int4 slot;
  ParamTrial *trial;
  undefined1 local_90 [8];
  AncestorRealistic ancestorReal;
  int local_44;
  int4 maxancestor;
  int4 i;
  const_iterator iterend;
  const_iterator iter;
  Varnode *vn;
  PcodeOp *op;
  ParamActive *active;
  Funcdata *data_local;
  ActionReturnRecovery *this_local;
  
  this_00 = Funcdata::getActiveOutput(data);
  if (this_00 != (ParamActive *)0x0) {
    std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&iterend);
    std::_List_const_iterator<PcodeOp_*>::_List_const_iterator
              ((_List_const_iterator<PcodeOp_*> *)&maxancestor);
    pAVar6 = Funcdata::getArch(data);
    iVar3 = pAVar6->trim_recurse_max;
    ancestorReal._56_8_ = Funcdata::endOp(data,CPUI_RETURN);
    _maxancestor = (const_iterator)ancestorReal._56_8_;
    AncestorRealistic::AncestorRealistic((AncestorRealistic *)local_90);
    iterend = Funcdata::beginOp(data,CPUI_RETURN);
    while (bVar2 = std::operator!=(&iterend,(_Self *)&maxancestor), bVar2) {
      ppPVar7 = std::_List_const_iterator<PcodeOp_*>::operator*(&iterend);
      pPVar1 = *ppPVar7;
      bVar2 = PcodeOp::isDead(pPVar1);
      if ((!bVar2) && (uVar5 = PcodeOp::getHaltType(pPVar1), uVar5 == 0)) {
        for (local_44 = 0; iVar4 = ParamActive::getNumTrials(this_00), local_44 < iVar4;
            local_44 = local_44 + 1) {
          this_01 = ParamActive::getTrial(this_00,local_44);
          bVar2 = ParamTrial::isChecked(this_01);
          if (!bVar2) {
            iVar4 = ParamTrial::getSlot(this_01);
            invn = PcodeOp::getIn(pPVar1,iVar4);
            bVar2 = AncestorRealistic::execute
                              ((AncestorRealistic *)local_90,pPVar1,iVar4,this_01,false);
            if ((bVar2) && (bVar2 = Funcdata::ancestorOpUse(data,iVar3,invn,pPVar1,this_01), bVar2))
            {
              ParamTrial::markActive(this_01);
            }
            (this->super_Action).count = (this->super_Action).count + 1;
          }
        }
      }
      std::_List_const_iterator<PcodeOp_*>::operator++(&iterend);
    }
    ParamActive::finishPass(this_00);
    iVar3 = ParamActive::getNumPasses(this_00);
    iVar4 = ParamActive::getMaxPass(this_00);
    if (iVar4 < iVar3) {
      ParamActive::markFullyChecked(this_00);
    }
    bVar2 = ParamActive::isFullyChecked(this_00);
    if (bVar2) {
      this_02 = Funcdata::getFuncProto(data);
      FuncProto::deriveOutputMap(this_02,this_00);
      _maxancestor = Funcdata::endOp(data,CPUI_RETURN);
      iterend = Funcdata::beginOp(data,CPUI_RETURN);
      while (bVar2 = std::operator!=(&iterend,(_Self *)&maxancestor), bVar2) {
        ppPVar7 = std::_List_const_iterator<PcodeOp_*>::operator*(&iterend);
        pPVar1 = *ppPVar7;
        bVar2 = PcodeOp::isDead(pPVar1);
        if ((!bVar2) && (uVar5 = PcodeOp::getHaltType(pPVar1), uVar5 == 0)) {
          buildReturnOutput(this_00,pPVar1,data);
        }
        std::_List_const_iterator<PcodeOp_*>::operator++(&iterend);
      }
      Funcdata::clearActiveOutput(data);
      (this->super_Action).count = (this->super_Action).count + 1;
    }
    AncestorRealistic::~AncestorRealistic((AncestorRealistic *)local_90);
  }
  return 0;
}

Assistant:

int4 ActionReturnRecovery::apply(Funcdata &data)

{
  ParamActive *active = data.getActiveOutput();
  if (active != (ParamActive *)0) {
    PcodeOp *op;
    Varnode *vn;
    list<PcodeOp *>::const_iterator iter,iterend;
    int4 i;
    
    int4 maxancestor = data.getArch()->trim_recurse_max;
    iterend = data.endOp(CPUI_RETURN);
    AncestorRealistic ancestorReal;
    for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
      op = *iter;
      if (op->isDead()) continue;
      if (op->getHaltType() != 0) continue; // Don't evaluate special halts
      for(i=0;i<active->getNumTrials();++i) {
	ParamTrial &trial(active->getTrial(i));
	if (trial.isChecked()) continue; // Already checked
	int4 slot = trial.getSlot();
	vn = op->getIn(slot);
	if (ancestorReal.execute(op,slot,&trial,false))
	  if (data.ancestorOpUse(maxancestor,vn,op,trial))
	    trial.markActive(); // This varnode sees active use as a parameter
	count += 1;
      }
    }

    active->finishPass();
    if (active->getNumPasses() > active->getMaxPass())
      active->markFullyChecked();
    
    if (active->isFullyChecked()) {
      data.getFuncProto().deriveOutputMap(active);
      iterend = data.endOp(CPUI_RETURN);
      for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
	op = *iter;
	if (op->isDead()) continue;
	if (op->getHaltType() != 0) continue;
	buildReturnOutput(active,op,data);
      }
      data.clearActiveOutput();
      count += 1;
    }
  }
  return 0;
}